

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_tcp_connect(uv_connect_t *req,uv_tcp_t *handle,sockaddr *addr,uv_connect_cb cb)

{
  uint local_34;
  uint addrlen;
  uv_connect_cb cb_local;
  sockaddr *addr_local;
  uv_tcp_t *handle_local;
  uv_connect_t *req_local;
  
  if (handle->type == UV_TCP) {
    if (addr->sa_family == 2) {
      local_34 = 0x10;
    }
    else {
      if (addr->sa_family != 10) {
        return -0x16;
      }
      local_34 = 0x1c;
    }
    req_local._4_4_ = uv__tcp_connect(req,handle,addr,local_34,cb);
  }
  else {
    req_local._4_4_ = -0x16;
  }
  return req_local._4_4_;
}

Assistant:

int uv_tcp_connect(uv_connect_t* req,
                   uv_tcp_t* handle,
                   const struct sockaddr* addr,
                   uv_connect_cb cb) {
  unsigned int addrlen;

  if (handle->type != UV_TCP)
    return UV_EINVAL;

  if (addr->sa_family == AF_INET)
    addrlen = sizeof(struct sockaddr_in);
  else if (addr->sa_family == AF_INET6)
    addrlen = sizeof(struct sockaddr_in6);
  else
    return UV_EINVAL;

  return uv__tcp_connect(req, handle, addr, addrlen, cb);
}